

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cc
# Opt level: O0

string * __thiscall
tvm::runtime::ModuleNode::GetSource(string *__return_storage_ptr__,ModuleNode *this,string *format)

{
  int iVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  allocator<char> local_1b5 [13];
  LogMessageFatal local_1a8;
  string *local_20;
  string *format_local;
  ModuleNode *this_local;
  
  local_20 = format;
  format_local = (string *)this;
  this_local = (ModuleNode *)__return_storage_ptr__;
  dmlc::LogMessageFatal::LogMessageFatal
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/module.cc"
             ,0x62);
  poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a8);
  poVar3 = std::operator<<((ostream *)poVar2,"Module[");
  iVar1 = (*this->_vptr_ModuleNode[2])();
  poVar3 = std::operator<<(poVar3,(char *)CONCAT44(extraout_var,iVar1));
  std::operator<<(poVar3,"] does not support GetSource");
  dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_1b5);
  std::allocator<char>::~allocator(local_1b5);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleNode::GetSource(const std::string &format) {
  LOG(FATAL) << "Module[" << type_key() << "] does not support GetSource";
  return "";
}